

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O3

void __thiscall
GlobOpt::ArrayUpperBoundCheckHoistInfo::SetLoop
          (ArrayUpperBoundCheckHoistInfo *this,Loop *loop,StackSym *indexSym,int indexOffset,
          int offset,Value *indexValue,IntConstantBounds *indexConstantBounds,
          Value *headSegmentLengthValue,IntConstantBounds *headSegmentLengthConstantBounds,
          bool isLoopCountBasedBound)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (headSegmentLengthValue == (Value *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x9b,"(headSegmentLengthValue)","headSegmentLengthValue");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  ArrayLowerBoundCheckHoistInfo::SetLoop
            (&this->super_ArrayLowerBoundCheckHoistInfo,loop,indexSym,indexOffset,offset,indexValue,
             indexConstantBounds,isLoopCountBasedBound);
  this->headSegmentLengthValue = headSegmentLengthValue;
  this->headSegmentLengthConstantBounds = *headSegmentLengthConstantBounds;
  return;
}

Assistant:

void GlobOpt::ArrayUpperBoundCheckHoistInfo::SetLoop(
    ::Loop *const loop,
    StackSym *const indexSym,
    const int indexOffset,
    const int offset,
    Value *const indexValue,
    const IntConstantBounds &indexConstantBounds,
    Value *const headSegmentLengthValue,
    const IntConstantBounds &headSegmentLengthConstantBounds,
    const bool isLoopCountBasedBound)
{
    Assert(headSegmentLengthValue);

    SetLoop(loop, indexSym, indexOffset, offset, indexValue, indexConstantBounds, isLoopCountBasedBound);
    this->headSegmentLengthValue = headSegmentLengthValue;
    this->headSegmentLengthConstantBounds = headSegmentLengthConstantBounds;
}